

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O3

bool __thiscall QFile::moveToTrash(QFile *this)

{
  QFileDevicePrivate *this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FileError FVar5;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QFileSystemEntry trashEntry;
  QFileSystemEntry fileEntry;
  QString local_b8;
  QSystemError local_a0;
  undefined1 local_98 [64];
  undefined1 local_58 [56];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  if (this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.parent ==
      (QObject *)0x0) {
    iVar4 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
              _vptr_QObjectData[7])(this_00);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x140))
                      ((long *)CONCAT44(extraout_var,iVar4));
    if (cVar1 != '\0') goto LAB_002341af;
    moveToTrash();
  }
  else {
LAB_002341af:
    QFileDevice::unsetError(&this->super_QFileDevice);
    (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
    FVar5 = QFileDevice::error(&this->super_QFileDevice);
    if (FVar5 == NoError) {
      local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_58,(QString *)(this_00 + 1));
      local_98._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_98);
      local_a0.errorCode = 0;
      local_a0.errorScope = NoError;
      bVar2 = QFileSystemEngine::moveFileToTrash
                        ((QFileSystemEntry *)local_58,(QFileSystemEntry *)local_98,&local_a0);
      if (bVar2) {
        QFileSystemEntry::filePath(&local_b8,(QFileSystemEntry *)local_98);
        setFileName(this,&local_b8);
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        QFileDevice::unsetError(&this->super_QFileDevice);
      }
      else {
        QSystemError::string(&local_b8,local_a0.errorScope,local_a0.errorCode);
        QFileDevicePrivate::setError(this_00,RenameError,&local_b8);
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((QArrayData *)local_98._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._24_8_,1,0x10);
        }
      }
      if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_58._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._24_8_,1,0x10);
        }
      }
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      bVar3 = true;
      if (bVar2) goto LAB_0023435a;
    }
  }
  bVar3 = false;
LAB_0023435a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::moveToTrash()
{
    Q_D(QFile);
    if (d->fileName.isEmpty() &&
        !static_cast<QFSFileEngine *>(d->engine())->isUnnamedFile()) {
        qWarning("QFile::remove: Empty or null file name");
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        QFileSystemEntry fileEntry(d->fileName);
        QFileSystemEntry trashEntry;
        QSystemError error;
        if (QFileSystemEngine::moveFileToTrash(fileEntry, trashEntry, error)) {
            setFileName(trashEntry.filePath());
            unsetError();
            return true;
        }
        d->setError(QFile::RenameError, error.toString());
    }
    return false;
}